

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O3

bool FIX::TimeRange::isInSameRange(DateTime *start,DateTime *end,DateTime *time1,DateTime *time2)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  
  bVar4 = isInRange(start,end,time1);
  if ((!bVar4) || (bVar4 = isInRange(start,end,time2), !bVar4)) {
    return false;
  }
  iVar7 = time1->m_date;
  iVar1 = time2->m_date;
  lVar5 = time1->m_time;
  lVar2 = time2->m_time;
  if (iVar7 == iVar1 && lVar5 == lVar2) {
    return true;
  }
  iVar9 = start->m_date;
  iVar10 = end->m_date;
  if (iVar10 <= iVar9) {
    lVar6 = start->m_time;
    lVar3 = end->m_time;
    if ((iVar10 < iVar9 || lVar3 <= lVar6) && (lVar6 != lVar3 || iVar9 - iVar10 != 0)) {
      iVar8 = (int)(SUB168(SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
              (SUB164(SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f);
      iVar10 = (iVar9 - iVar10) * -0x15180 + iVar8 +
               ((int)(SUB168(SEXT816(lVar3) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
               (SUB164(SEXT816(lVar3) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) + 0x15180;
      if ((iVar7 < iVar1) || (lVar5 < lVar2 && (iVar7 - iVar1 == 0 || iVar7 < iVar1))) {
        iVar7 = ((int)(SUB168(SEXT816(lVar5) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
                (SUB164(SEXT816(lVar5) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f)) +
                ((int)(SUB168(SEXT816(lVar2) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                (SUB164(SEXT816(lVar2) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) +
                (iVar1 - iVar7) * 0x15180;
        bVar12 = SBORROW4(iVar10,iVar7);
        bVar11 = iVar10 - iVar7 < 0;
        bVar4 = iVar10 == iVar7;
      }
      else {
        iVar9 = iVar8 + (int)(lVar2 / 1000000000) + iVar9 * -0x15180;
        lVar6 = (long)iVar9 + 0x15180;
        if (-1 < iVar9) {
          lVar6 = (long)iVar9;
        }
        lVar5 = (long)(((int)(SUB168(SEXT816(lVar2) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
                       (SUB164(SEXT816(lVar2) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f)) +
                       ((int)(SUB168(SEXT816(lVar5) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                       (SUB164(SEXT816(lVar5) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) +
                      (iVar7 - iVar1) * 0x15180);
        lVar6 = iVar10 - lVar6;
        bVar12 = SBORROW8(lVar6,lVar5);
        bVar11 = lVar6 - lVar5 < 0;
        bVar4 = lVar6 == lVar5;
      }
      return !bVar4 && bVar12 == bVar11;
    }
  }
  return time1->m_date == time2->m_date;
}

Assistant:

bool TimeRange::isInSameRange(
    const DateTime &start,
    const DateTime &end,
    const DateTime &time1,
    const DateTime &time2) {
  if (!isInRange(start, end, time1)) {
    return false;
  }
  if (!isInRange(start, end, time2)) {
    return false;
  }

  if (time1 == time2) {
    return true;
  }

  if (start < end || start == end) {
    UtcDate time1Date(time1);
    UtcDate time2Date(time2);

    return time1Date == time2Date;
  } else {
    int sessionLength = DateTime::SECONDS_PER_DAY - (start - end);

    if (time1 > time2) {
      UtcTimeOnly time2TimeOnly = UtcTimeOnly(time2);

      long delta = time2TimeOnly - start;
      if (delta < 0) {
        delta = DateTime::SECONDS_PER_DAY - labs(delta);
      }

      return (time1 - time2) < (sessionLength - delta);
    } else {
      return (time2 - time1) < sessionLength;
    }
  }
}